

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketData.h
# Opt level: O0

void __thiscall
uWS::WebSocketData::WebSocketData
          (WebSocketData *this,bool perMessageDeflate,int compressOptions,string *backpressure)

{
  void *pvVar1;
  uint in_EDX;
  byte in_SIL;
  long in_RDI;
  string *in_stack_ffffffffffffffb8;
  WebSocketState<true> *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffdc;
  DeflationStream *in_stack_ffffffffffffffe0;
  
  AsyncSocketData<false>::AsyncSocketData
            ((AsyncSocketData<false> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  WebSocketState<true>::WebSocketState(in_stack_ffffffffffffffc0);
  std::__cxx11::string::string((string *)(in_RDI + 0x38));
  *(undefined4 *)(in_RDI + 0x58) = 0;
  *(undefined1 *)(in_RDI + 0x5c) = 0;
  *(undefined8 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(bool *)(in_RDI + 0x5d) = (in_SIL & 1) != 0;
  if (((in_SIL & 1) != 0) && ((in_EDX & 2) != 0)) {
    pvVar1 = operator_new(0x70);
    DeflationStream::DeflationStream(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    *(void **)(in_RDI + 0x60) = pvVar1;
  }
  return;
}

Assistant:

WebSocketData(bool perMessageDeflate, int compressOptions, std::string &&backpressure) : AsyncSocketData<false>(std::move(backpressure)), WebSocketState<true>() {
        compressionStatus = perMessageDeflate ? ENABLED : DISABLED;

        /* Initialize the dedicated sliding window */
        if (perMessageDeflate && (compressOptions & CompressOptions::DEDICATED_COMPRESSOR)) {
            deflationStream = new DeflationStream(compressOptions);
        }
    }